

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# numeric.cpp
# Opt level: O0

void __thiscall
clickhouse::ColumnVector<unsigned_int>::Append(ColumnVector<unsigned_int> *this,ColumnRef *column)

{
  bool bVar1;
  iterator __first;
  iterator __last;
  iterator this_00;
  Column *in_RSI;
  shared_ptr<clickhouse::ColumnVector<unsigned_int>_> col;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *in_stack_ffffffffffffff78;
  __normal_iterator<const_unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
  *in_stack_ffffffffffffff80;
  const_iterator in_stack_ffffffffffffffd8;
  __shared_ptr local_20 [32];
  
  std::__shared_ptr_access<clickhouse::Column,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
            ((__shared_ptr_access<clickhouse::Column,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
             0x217103);
  Column::As<clickhouse::ColumnVector<unsigned_int>>(in_RSI);
  bVar1 = std::__shared_ptr::operator_cast_to_bool(local_20);
  if (bVar1) {
    __first = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::end
                        (in_stack_ffffffffffffff78);
    __gnu_cxx::
    __normal_iterator<unsigned_int_const*,std::vector<unsigned_int,std::allocator<unsigned_int>>>::
    __normal_iterator<unsigned_int*>
              (in_stack_ffffffffffffff80,
               (__normal_iterator<unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
                *)in_stack_ffffffffffffff78);
    std::
    __shared_ptr_access<clickhouse::ColumnVector<unsigned_int>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
    ::operator->((__shared_ptr_access<clickhouse::ColumnVector<unsigned_int>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                  *)0x217159);
    __last = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::begin
                       (in_stack_ffffffffffffff78);
    std::
    __shared_ptr_access<clickhouse::ColumnVector<unsigned_int>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
    ::operator->((__shared_ptr_access<clickhouse::ColumnVector<unsigned_int>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                  *)0x217174);
    this_00 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::end
                        (in_stack_ffffffffffffff78);
    std::vector<unsigned_int,std::allocator<unsigned_int>>::
    insert<__gnu_cxx::__normal_iterator<unsigned_int*,std::vector<unsigned_int,std::allocator<unsigned_int>>>,void>
              ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)this_00._M_current,
               in_stack_ffffffffffffffd8,
               (__normal_iterator<unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
                )__first._M_current,
               (__normal_iterator<unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
                )__last._M_current);
  }
  std::shared_ptr<clickhouse::ColumnVector<unsigned_int>_>::~shared_ptr
            ((shared_ptr<clickhouse::ColumnVector<unsigned_int>_> *)0x2171d5);
  return;
}

Assistant:

void ColumnVector<T>::Append(ColumnRef column) {
    if (auto col = column->As<ColumnVector<T>>()) {
        data_.insert(data_.end(), col->data_.begin(), col->data_.end());
    }
}